

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_vector(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_8c;
  operand local_88;
  operand local_84;
  string lab;
  int local_5c;
  string done;
  string done2;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done2,psVar1,lab_00);
  if (ops->safe_primitives == true) {
    lab._M_dataplus._M_p._0_4_ = 0x40;
    local_8c = RAX;
    local_88 = R11;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&lab,&local_8c,&local_88);
    lab._M_dataplus._M_p._0_4_ = 0x2b;
    local_8c = RAX;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&lab,&local_8c);
    check_heap(code,re_vector_heap_overflow);
  }
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = RAX;
  local_88 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,&local_88);
  local_8c = ST6;
  local_88 = R15;
  local_84 = NUMBER;
  lab._M_dataplus._M_p = (pointer)0x600000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_8c,&local_88,&local_84,(unsigned_long *)&lab);
  lab._M_dataplus._M_p._0_4_ = 0x49;
  local_8c = RAX;
  local_88 = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,&local_88);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = R15;
  local_88 = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,&local_88);
  lab._M_dataplus._M_p._0_4_ = 0x49;
  local_8c = R15;
  local_88 = NUMBER;
  local_84 = CL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,&local_88);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = DH;
  local_84 = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = RBP;
  local_84 = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = AH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = R15;
  local_84 = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = BL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_84 = RDI;
  local_88 = local_8c;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = BH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = MEM_R15;
  local_84 = R8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  local_84 = CL;
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = BYTE_MEM_RBP;
  local_84 = R9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = CH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_88 = BYTE_MEM_R15;
  local_84 = R12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  local_88 = ST6;
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = MEM_RBP;
  local_84 = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&lab,&local_8c,(int *)&local_88,&local_84);
  lab._M_dataplus._M_p._0_4_ = 5;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&lab,&done);
  lab._M_dataplus._M_p._0_4_ = 0x58;
  local_8c = R11;
  local_88 = NUMBER;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p = lab._M_dataplus._M_p & 0xffffffff00000000;
  local_8c = RBP;
  local_88 = NUMBER;
  local_84 = XMM5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  lab._M_dataplus._M_p._0_4_ = 0x40;
  local_8c = RDX;
  local_88 = MEM_R10;
  local_84 = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&lab,&local_8c,&local_88,(int *)&local_84);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab,psVar1,lab_01);
  local_8c = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_8c,&lab);
  local_8c = ST6;
  local_88 = RCX;
  local_84 = MEM_RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_8c,&local_88,&local_84);
  local_8c = ST6;
  local_88 = MEM_RBP;
  local_84 = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_8c,&local_88,&local_84);
  local_8c = EMPTY;
  local_88 = RBP;
  local_84 = NUMBER;
  local_5c = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_8c,&local_88,&local_84,&local_5c);
  local_8c = EMPTY;
  local_88 = RDX;
  local_84 = NUMBER;
  local_5c = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_8c,&local_88,&local_84,&local_5c);
  local_8c = RSI;
  local_88 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_8c,&local_88);
  local_8c = BYTE_MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,&local_8c,&done2);
  local_8c = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_8c,&lab);
  local_8c = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_8c,&done)
  ;
  local_8c = BYTE_MEM_RCX;
  local_88 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_8c,&local_88);
  local_8c = XMM13|CL;
  local_88 = R11;
  local_84 = NUMBER;
  local_5c = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_8c,&local_88,&local_84,&local_5c);
  local_8c = EMPTY;
  local_88 = RBP;
  local_84 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_8c,&local_88,&local_84);
  local_8c = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,&local_8c,&done2);
  local_8c = ST6;
  local_88 = RAX;
  local_84 = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_8c,&local_88,&local_84);
  local_8c = BYTE_MEM_RDX;
  local_88 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_8c,&local_88);
  std::__cxx11::string::~string((string *)&lab);
  std::__cxx11::string::~string((string *)&done2);
  std::__cxx11::string::~string((string *)&done);
  return;
}

Assistant:

void compile_vector(asmcode& code, const compiler_options& ops)
  {
  auto done = label_to_string(label++);
  auto done2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
    code.add(asmcode::INC, asmcode::RAX);
    check_heap(code, re_vector_heap_overflow);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)vector_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, done); // assembly can jump short, but vm cannot
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RCX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RDX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(3), asmcode::RSI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(4), asmcode::RDI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(5), asmcode::R8);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(6), asmcode::R9);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(7), asmcode::R12);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(8), asmcode::R14);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JES, done);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(9));
  code.add(asmcode::MOV, asmcode::RDX, LOCAL);

  auto lab = label_to_string(label++);
  code.add(asmcode::LABEL, lab);

  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RDX);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RCX);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::JE, done2);
  code.add(asmcode::JMPS, lab);

  code.add(asmcode::LABEL, done);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, ALLOC, asmcode::R11);
  code.add(asmcode::LABEL, done2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::JMP, CONTINUE);
  }